

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrfac_.c
# Opt level: O1

void qrfac_(int *m,int *n,double *a,int *lda,int *pivot,int *ipvt,int *lipvt,double *rdiag,
           double *acnorm,double *wa)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  double *pdVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  double *pdVar11;
  ulong uVar12;
  double *x;
  long lVar13;
  long lVar14;
  int *piVar15;
  uint *puVar16;
  long lVar17;
  double *pdVar18;
  ulong uVar19;
  double *pdVar20;
  uint *puVar21;
  double dVar22;
  int c__1;
  uint local_ec;
  double *local_e8;
  uint local_dc;
  int *local_d8;
  ulong local_d0;
  int local_c4;
  long local_c0;
  long local_b8;
  ulong local_b0;
  double *local_a8;
  uint *local_a0;
  long local_98;
  uint *local_90;
  int *local_88;
  double *local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  long local_60;
  double local_58;
  int local_4c;
  double local_48;
  
  local_4c = 1;
  local_d0 = (ulong)*lda;
  uVar12 = ~local_d0;
  local_e8 = a;
  local_d8 = pivot;
  local_88 = ipvt;
  local_58 = dpmpar_(&local_4c);
  uVar10 = local_d0;
  uVar6 = *n;
  local_a0 = (uint *)m;
  local_90 = (uint *)n;
  if (0 < (int)uVar6) {
    pdVar20 = local_e8 + local_d0 + uVar12 + 1;
    uVar19 = 0;
    do {
      dVar22 = enorm_((int *)local_a0,pdVar20);
      acnorm[uVar19] = dVar22;
      rdiag[uVar19] = dVar22;
      wa[uVar19] = dVar22;
      if (*local_d8 != 0) {
        local_88[uVar19] = (int)uVar19 + 1;
      }
      uVar19 = uVar19 + 1;
      pdVar20 = pdVar20 + uVar10;
    } while (uVar6 != uVar19);
  }
  uVar6 = *local_90;
  if ((int)*local_a0 < (int)*local_90) {
    uVar6 = *local_a0;
  }
  if (0 < (int)uVar6) {
    local_78 = local_e8 + uVar12;
    local_b0 = (ulong)(uVar6 + 1);
    local_70 = local_78 + 1;
    local_c0 = local_d0 * 8;
    local_a8 = local_78 + local_d0;
    local_60 = local_d0 * 8 + 8;
    local_80 = local_e8 + uVar12 + 1;
    uVar10 = 1;
    local_c4 = 2;
    local_b8 = -1;
    local_98 = 0;
    piVar15 = local_d8;
    puVar16 = local_a0;
    pdVar20 = local_a8;
    puVar21 = local_90;
    do {
      pdVar5 = local_78;
      uVar6 = (uint)uVar10;
      if (*piVar15 != 0) {
        uVar7 = uVar6;
        if ((long)uVar10 <= (long)(int)*puVar21) {
          uVar12 = uVar10;
          uVar19 = uVar10 & 0xffffffff;
          do {
            uVar8 = uVar12 & 0xffffffff;
            if (rdiag[uVar12 - 1] < rdiag[(long)(int)uVar19 + -1] ||
                rdiag[uVar12 - 1] == rdiag[(long)(int)uVar19 + -1]) {
              uVar8 = uVar19;
            }
            uVar12 = uVar12 + 1;
            uVar7 = (uint)uVar8;
            uVar19 = uVar8;
          } while (*puVar21 + 1 != uVar12);
        }
        if (uVar10 != uVar7) {
          uVar2 = *puVar16;
          if (0 < (int)uVar2) {
            lVar13 = 1;
            do {
              dVar22 = local_a8[lVar13];
              local_a8[lVar13] = local_78[(int)(uVar7 * (int)local_d0) + lVar13];
              local_78[(int)(uVar7 * (int)local_d0) + lVar13] = dVar22;
              lVar13 = lVar13 + 1;
            } while ((ulong)uVar2 + 1 != lVar13);
          }
          rdiag[(long)(int)uVar7 + -1] = rdiag[uVar10 - 1];
          wa[(long)(int)uVar7 + -1] = wa[uVar10 - 1];
          iVar3 = local_88[uVar10 - 1];
          local_88[uVar10 - 1] = local_88[(long)(int)uVar7 + -1];
          local_88[(long)(int)uVar7 + -1] = iVar3;
        }
      }
      local_ec = (*puVar16 - uVar6) + 1;
      x = local_78 + uVar10 + (long)(int)((int)local_d0 * uVar6);
      local_e8 = (double *)uVar10;
      dVar22 = enorm_((int *)&local_ec,x);
      pdVar11 = (double *)uVar10;
      piVar15 = local_d8;
      lVar13 = local_c0;
      lVar17 = local_b8;
      if ((dVar22 != 0.0) || (NAN(dVar22))) {
        dVar22 = (double)(~-(ulong)(*x < 0.0) & (ulong)dVar22 | (ulong)-dVar22 & -(ulong)(*x < 0.0))
        ;
        uVar6 = *puVar16;
        if ((long)uVar10 <= (long)(int)uVar6) {
          lVar9 = 1;
          do {
            pdVar20[lVar9] = pdVar20[lVar9] / dVar22;
            lVar9 = lVar9 + 1;
          } while ((ulong)(uVar6 + 1) + local_98 != lVar9);
        }
        *x = *x + 1.0;
        local_ec = *puVar21;
        if ((long)uVar10 < (long)(int)local_ec) {
          pdVar18 = (double *)(local_c0 * local_c4 + (long)local_80);
          local_68 = local_70 + uVar10;
          lVar9 = (long)local_c4;
          local_48 = dVar22;
          do {
            local_dc = *puVar16;
            dVar22 = 0.0;
            if ((long)pdVar11 <= (long)(int)local_dc) {
              lVar14 = 1;
              do {
                dVar22 = dVar22 + pdVar20[lVar14] * pdVar18[lVar14 + -1];
                lVar14 = lVar14 + 1;
              } while ((ulong)(local_dc + 1) + local_98 != lVar14);
            }
            dVar1 = *x;
            if ((long)local_e8 <= (long)(int)local_dc) {
              lVar14 = 0;
              do {
                pdVar18[lVar14] = pdVar20[lVar14 + 1] * (-dVar22 / dVar1) + pdVar18[lVar14];
                lVar14 = lVar14 + 1;
              } while ((ulong)(local_dc + 1) + lVar17 != lVar14);
            }
            if (*piVar15 != 0) {
              dVar22 = rdiag[lVar9 + -1];
              if ((dVar22 != 0.0) || (NAN(dVar22))) {
                lVar14 = lVar9 * local_d0;
                dVar22 = 1.0 - (pdVar5[uVar10 + lVar14] / dVar22) *
                               (pdVar5[uVar10 + lVar14] / dVar22);
                dVar22 = (double)(~-(ulong)(dVar22 <= 0.0) & (ulong)dVar22);
                if (dVar22 < 0.0) {
                  dVar22 = sqrt(dVar22);
                  piVar15 = local_d8;
                  puVar16 = local_a0;
                  lVar13 = local_c0;
                  lVar17 = local_b8;
                }
                else {
                  dVar22 = SQRT(dVar22);
                }
                dVar1 = rdiag[lVar9 + -1];
                rdiag[lVar9 + -1] = dVar22 * dVar1;
                dVar22 = (dVar22 * dVar1) / wa[lVar9 + -1];
                if (dVar22 * dVar22 * 0.05 <= local_58) {
                  local_dc = *puVar16 - (int)local_e8;
                  dVar22 = enorm_((int *)&local_dc,local_68 + lVar14);
                  rdiag[lVar9 + -1] = dVar22;
                  wa[lVar9 + -1] = dVar22;
                  piVar15 = local_d8;
                  puVar16 = local_a0;
                  lVar13 = local_c0;
                  lVar17 = local_b8;
                }
              }
            }
            pdVar18 = (double *)((long)pdVar18 + lVar13);
            bVar4 = lVar9 < (int)local_ec;
            pdVar11 = local_e8;
            lVar9 = lVar9 + 1;
            puVar21 = local_90;
            dVar22 = local_48;
          } while (bVar4);
        }
      }
      rdiag[(long)pdVar11 - 1] = -dVar22;
      uVar10 = (long)pdVar11 + 1;
      local_c4 = local_c4 + 1;
      local_a8 = (double *)((long)local_a8 + lVar13);
      pdVar20 = (double *)((long)pdVar20 + local_60);
      local_98 = local_98 + -1;
      local_80 = local_80 + 1;
      local_b8 = lVar17 + -1;
    } while (uVar10 != local_b0);
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(qrfac)(const int *m, const int *n, real *a, const int *
	lda, const int *pivot, int *ipvt, const int *lipvt, real *rdiag,
	 real *acnorm, real *wa)
{
    /* Initialized data */

#define p05 .05
    const int c__1 = 1;

    /* System generated locals */
    int a_dim1, a_offset, i__1, i__2, i__3;
    real d__1, d__2, d__3;

    /* Local variables */
    int i__, j, k, jp1;
    real sum;
    int kmax;
    real temp;
    int minmn;
    real epsmch;
    real ajnorm;

/*     ********** */

/*     subroutine qrfac */

/*     this subroutine uses householder transformations with column */
/*     pivoting (optional) to compute a qr factorization of the */
/*     m by n matrix a. that is, qrfac determines an orthogonal */
/*     matrix q, a permutation matrix p, and an upper trapezoidal */
/*     matrix r with diagonal elements of nonincreasing magnitude, */
/*     such that a*p = q*r. the householder transformation for */
/*     column k, k = 1,2,...,min(m,n), is of the form */

/*                           t */
/*           i - (1/u(k))*u*u */

/*     where u has zeros in the first k-1 positions. the form of */
/*     this transformation and the method of pivoting first */
/*     appeared in the corresponding linpack subroutine. */

/*     the subroutine statement is */

/*       subroutine qrfac(m,n,a,lda,pivot,ipvt,lipvt,rdiag,acnorm,wa) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of rows of a. */

/*       n is a positive integer input variable set to the number */
/*         of columns of a. */

/*       a is an m by n array. on input a contains the matrix for */
/*         which the qr factorization is to be computed. on output */
/*         the strict upper trapezoidal part of a contains the strict */
/*         upper trapezoidal part of r, and the lower trapezoidal */
/*         part of a contains a factored form of q (the non-trivial */
/*         elements of the u vectors described above). */

/*       lda is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array a. */

/*       pivot is a logical input variable. if pivot is set true, */
/*         then column pivoting is enforced. if pivot is set false, */
/*         then no column pivoting is done. */

/*       ipvt is an integer output array of length lipvt. ipvt */
/*         defines the permutation matrix p such that a*p = q*r. */
/*         column j of p is column ipvt(j) of the identity matrix. */
/*         if pivot is false, ipvt is not referenced. */

/*       lipvt is a positive integer input variable. if pivot is false, */
/*         then lipvt may be as small as 1. if pivot is true, then */
/*         lipvt must be at least n. */

/*       rdiag is an output array of length n which contains the */
/*         diagonal elements of r. */

/*       acnorm is an output array of length n which contains the */
/*         norms of the corresponding columns of the input matrix a. */
/*         if this information is not needed, then acnorm can coincide */
/*         with rdiag. */

/*       wa is a work array of length n. if pivot is false, then wa */
/*         can coincide with rdiag. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm */

/*       fortran-supplied ... dmax1,dsqrt,min0 */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa;
    --acnorm;
    --rdiag;
    a_dim1 = *lda;
    a_offset = 1 + a_dim1 * 1;
    a -= a_offset;
    --ipvt;
    (void)lipvt;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __minpack_func__(dpmpar)(&c__1);

/*     compute the initial column norms and initialize several arrays. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	acnorm[j] = __minpack_func__(enorm)(m, &a[j * a_dim1 + 1]);
	rdiag[j] = acnorm[j];
	wa[j] = rdiag[j];
	if (*pivot) {
	    ipvt[j] = j;
	}
/* L10: */
    }

/*     reduce a to r with householder transformations. */

    minmn = min(*m,*n);
    i__1 = minmn;
    for (j = 1; j <= i__1; ++j) {
	if (! (*pivot)) {
	    goto L40;
	}

/*        bring the column of largest norm into the pivot position. */

	kmax = j;
	i__2 = *n;
	for (k = j; k <= i__2; ++k) {
	    if (rdiag[k] > rdiag[kmax]) {
		kmax = k;
	    }
/* L20: */
	}
	if (kmax == j) {
	    goto L40;
	}
	i__2 = *m;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    temp = a[i__ + j * a_dim1];
	    a[i__ + j * a_dim1] = a[i__ + kmax * a_dim1];
	    a[i__ + kmax * a_dim1] = temp;
/* L30: */
	}
	rdiag[kmax] = rdiag[j];
	wa[kmax] = wa[j];
	k = ipvt[j];
	ipvt[j] = ipvt[kmax];
	ipvt[kmax] = k;
L40:

/*        compute the householder transformation to reduce the */
/*        j-th column of a to a multiple of the j-th unit vector. */

	i__2 = *m - j + 1;
	ajnorm = __minpack_func__(enorm)(&i__2, &a[j + j * a_dim1]);
	if (ajnorm == 0.) {
	    goto L100;
	}
	if (a[j + j * a_dim1] < 0.) {
	    ajnorm = -ajnorm;
	}
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
	    a[i__ + j * a_dim1] /= ajnorm;
/* L50: */
	}
	a[j + j * a_dim1] += 1;

/*        apply the transformation to the remaining columns */
/*        and update the norms. */

	jp1 = j + 1;
	if (*n < jp1) {
	    goto L100;
	}
	i__2 = *n;
	for (k = jp1; k <= i__2; ++k) {
	    sum = 0.;
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
		sum += a[i__ + j * a_dim1] * a[i__ + k * a_dim1];
/* L60: */
	    }
	    temp = sum / a[j + j * a_dim1];
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
		a[i__ + k * a_dim1] -= temp * a[i__ + j * a_dim1];
/* L70: */
	    }
	    if (! (*pivot) || rdiag[k] == 0.) {
		goto L80;
	    }
	    temp = a[j + k * a_dim1] / rdiag[k];
/* Computing MAX */
/* Computing 2nd power */
	    d__3 = temp;
	    d__1 = 0., d__2 = 1 - d__3 * d__3;
	    rdiag[k] *= sqrt((max(d__1,d__2)));
/* Computing 2nd power */
	    d__1 = rdiag[k] / wa[k];
	    if (p05 * (d__1 * d__1) > epsmch) {
		goto L80;
	    }
	    i__3 = *m - j;
	    rdiag[k] = __minpack_func__(enorm)(&i__3, &a[jp1 + k * a_dim1]);
	    wa[k] = rdiag[k];
L80:
/* L90: */
	    ;
	}
L100:
	rdiag[j] = -ajnorm;
/* L110: */
    }
    return;

/*     last card of subroutine qrfac. */

}